

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O0

type_id value_type_id(value v)

{
  void *data;
  long in_RDI;
  size_t offset;
  size_t size;
  type_id id;
  value in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  type_id tVar1;
  
  tVar1 = 0x14;
  if (in_RDI != 0) {
    data = (void *)value_size(in_stack_ffffffffffffffd8);
    value_to((value)CONCAT44(tVar1,in_stack_fffffffffffffff0),data,(long)data - 4);
  }
  return tVar1;
}

Assistant:

type_id value_type_id(value v)
{
	type_id id = TYPE_INVALID;

	if (v != NULL)
	{
		size_t size = value_size(v);

		size_t offset = size - sizeof(type_id);

		value_to((value)(((uintptr_t)v) + offset), &id, sizeof(type_id));
	}

	return id;
}